

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hwpq_test.cpp
# Opt level: O3

int32_t main(int argc,char **argv)

{
  int iVar1;
  long *plVar2;
  char *pcVar3;
  char *pcVar4;
  long *__arg;
  long lVar5;
  int32_t iVar6;
  ulong uVar7;
  pthread_t *ppVar8;
  int32_t option_index;
  VdppCmdCfg vdpp_cmd_cfg;
  int local_274;
  char local_270 [128];
  char local_1f0 [128];
  char local_170 [128];
  char local_f0 [128];
  int local_70;
  int local_6c;
  int local_68;
  int local_64;
  int local_60;
  int local_5c;
  int local_58;
  int local_54;
  int local_50;
  int local_4c;
  int local_48;
  int local_44;
  int local_40;
  int local_3c;
  int local_38;
  int local_34;
  
  _mpp_log_l(4,"hwpq_test","in parse 3\n",0);
  local_274 = 0;
  _opterr = 0;
  local_38 = 1;
LAB_00102329:
  do {
    iVar1 = getopt_long_only(argc,argv,"",parse_cmd(char**,int,VdppCmdCfg*)::long_options,&local_274
                            );
    if (iVar1 != 0) break;
    switch(local_274) {
    case 0:
      strncpy(local_270,_optarg,0x7f);
      pcVar3 = "ssrc file name: %s\n";
      pcVar4 = local_270;
      goto LAB_001024d0;
    case 1:
      strncpy(local_1f0,_optarg,0x7f);
      pcVar3 = "ddst-Y file name: %s\n";
      pcVar4 = local_1f0;
      goto LAB_001024d0;
    case 2:
      strncpy(local_170,_optarg,0x7f);
      pcVar3 = "ddst-UV file name: %s\n";
      pcVar4 = local_170;
      goto LAB_001024d0;
    case 3:
      strncpy(local_f0,_optarg,0x7f);
      pcVar3 = "ddst-Hist file name: %s\n";
      pcVar4 = local_f0;
LAB_001024d0:
      _mpp_log_l(4,"hwpq_test",pcVar3,0,pcVar4);
      break;
    case 4:
      local_70 = atoi(_optarg);
      break;
    case 5:
      local_6c = atoi(_optarg);
      break;
    case 6:
      local_68 = atoi(_optarg);
      break;
    case 7:
      local_64 = atoi(_optarg);
      break;
    case 8:
      local_60 = atoi(_optarg);
      break;
    case 9:
      local_5c = atoi(_optarg);
      break;
    case 10:
      local_58 = atoi(_optarg);
      break;
    case 0xb:
      local_54 = atoi(_optarg);
      break;
    case 0xc:
      local_50 = atoi(_optarg);
      break;
    case 0xd:
      local_4c = atoi(_optarg);
      break;
    case 0xe:
      local_48 = atoi(_optarg);
      break;
    case 0xf:
      local_44 = atoi(_optarg);
      break;
    case 0x10:
      local_40 = atoi(_optarg);
      break;
    case 0x11:
      local_3c = atoi(_optarg);
      break;
    case 0x12:
      local_38 = atoi(_optarg);
      if (local_38 < 2) {
        local_38 = 1;
      }
      break;
    case 0x13:
      local_34 = atoi(_optarg);
    }
    _mpp_log_l(4,"hwpq_test","%s: %s",0,
               *(undefined8 *)
                (parse_cmd(char**,int,VdppCmdCfg*)::long_options + (long)local_274 * 0x20),_optarg);
  } while( true );
  if (iVar1 == -1) goto LAB_001025a7;
  goto LAB_00102329;
LAB_001025a7:
  plVar2 = (long *)mpp_osal_calloc("main");
  if (plVar2 == (long *)0x0) {
    _mpp_log_l(2,"hwpq_test","failed to alloc context for instances\n",0);
    return -4;
  }
  if (0 < local_38) {
    uVar7 = 0;
    __arg = plVar2;
    do {
      *__arg = (long)local_270;
      *(int *)(__arg + 1) = (int)uVar7;
      iVar1 = pthread_create((pthread_t *)(__arg + 2),(pthread_attr_t *)0x0,multi_vdpp,__arg);
      if (iVar1 != 0) {
        _mpp_log_l(2,"hwpq_test","failed to create thread %d\n",0,uVar7 & 0xffffffff);
        iVar6 = -1;
        goto LAB_001026a1;
      }
      uVar7 = uVar7 + 1;
      __arg = __arg + 9;
    } while ((long)uVar7 < (long)local_38);
    if (0 < local_38) {
      ppVar8 = (pthread_t *)(plVar2 + 2);
      iVar6 = 0;
      lVar5 = 0;
      do {
        pthread_join(*ppVar8,(void **)0x0);
        lVar5 = lVar5 + 1;
        ppVar8 = ppVar8 + 9;
      } while (lVar5 < local_38);
      goto LAB_001026a1;
    }
  }
  iVar6 = 0;
LAB_001026a1:
  mpp_osal_free("main",plVar2);
  return iVar6;
}

Assistant:

int32_t main(int argc, char **argv)
{
    VdppCmdCfg vdpp_cmd_cfg;
    VdppCmdCfg *p_cmd_cfg = &vdpp_cmd_cfg;
    VdppTestMultiCtxInfo *ctxs = NULL;
    int i = 0;
    int ret = 0;

    parse_cmd(argv, argc, p_cmd_cfg);

    ctxs = mpp_calloc(VdppTestMultiCtxInfo, p_cmd_cfg->nthreads);
    if (NULL == ctxs) {
        mpp_err("failed to alloc context for instances\n");
        ret = MPP_ERR_MALLOC;
        goto __RET;
    }

    for (i = 0; i < p_cmd_cfg->nthreads; i++) {
        ctxs[i].cmd = p_cmd_cfg;
        ctxs[i].chn = i;

        ret = pthread_create(&ctxs[i].thd, NULL, multi_vdpp, &ctxs[i]);
        if (ret) {
            mpp_err("failed to create thread %d\n", i);
            ret = MPP_NOK;
            goto __RET;
        }
    }

    for (i = 0; i < p_cmd_cfg->nthreads; i++)
        pthread_join(ctxs[i].thd, NULL);

__RET:
    MPP_FREE(ctxs);
    ctxs = NULL;

    return ret;
}